

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexture.cpp
# Opt level: O0

void tcu::anon_unknown_75::writeUint32High24(deUint8 *dst,deUint32 val)

{
  deUint32 uint32ByteOffset8To32;
  deUint32 val_local;
  deUint8 *dst_local;
  
  writeUint24(dst + 1,val);
  return;
}

Assistant:

inline void writeUint32High24 (deUint8* dst, deUint32 val)
{
#if (DE_ENDIANNESS == DE_LITTLE_ENDIAN)
	const deUint32 uint32ByteOffset8To32	= 1;
#else
	const deUint32 uint32ByteOffset8To32	= 0;
#endif

	writeUint24(dst + uint32ByteOffset8To32, val);
}